

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O0

DynamicType *
Js::SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_true>::
InternalCreateTypeForNewScObject<true>
          (ScriptContext *scriptContext,DynamicType *type,PropertyIdArray *propIds,bool shareType)

{
  code *pcVar1;
  uint initialCapacity;
  bool bVar2;
  byte bVar3;
  uint16 inlineSlotCapacity;
  uint16 offsetOfInlineSlots;
  undefined4 *puVar4;
  DynamicTypeHandler *pDVar5;
  Recycler *pRVar6;
  DynamicType *this;
  PropertyRecord *local_a8;
  TrackAllocData local_80;
  PropertyAttributes local_51;
  PropertyRecord *pPStack_50;
  PropertyAttributes attr;
  PropertyRecord *propertyRecord;
  PropertyId propertyId;
  uint i;
  SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_true> *typeHandler;
  Recycler *pRStack_30;
  uint count;
  Recycler *recycler;
  PropertyIdArray *pPStack_20;
  bool shareType_local;
  PropertyIdArray *propIds_local;
  DynamicType *type_local;
  ScriptContext *scriptContext_local;
  
  recycler._7_1_ = shareType;
  pPStack_20 = propIds;
  propIds_local = (PropertyIdArray *)type;
  type_local = (DynamicType *)scriptContext;
  pRStack_30 = ScriptContext::GetRecycler(scriptContext);
  typeHandler._4_4_ = pPStack_20->count;
  if (0x3fffffff < typeHandler._4_4_) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x166,"(count <= static_cast<uint>(MaxPropertyIndexSize))",
                                "count <= static_cast<uint>(MaxPropertyIndexSize)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  pRVar6 = pRStack_30;
  initialCapacity = typeHandler._4_4_;
  pDVar5 = DynamicType::GetTypeHandler((DynamicType *)propIds_local);
  inlineSlotCapacity = DynamicTypeHandler::GetInlineSlotCapacity(pDVar5);
  pDVar5 = DynamicType::GetTypeHandler((DynamicType *)propIds_local);
  offsetOfInlineSlots = DynamicTypeHandler::GetOffsetOfInlineSlots(pDVar5);
  _propertyId = New(pRVar6,initialCapacity,inlineSlotCapacity,offsetOfInlineSlots,true,
                    (bool)(recycler._7_1_ & 1));
  if ((recycler._7_1_ & 1) == 0) {
    DynamicTypeHandler::SetMayBecomeShared(&_propertyId->super_DynamicTypeHandler);
  }
  for (propertyRecord._4_4_ = 0; propertyRecord._4_4_ < typeHandler._4_4_;
      propertyRecord._4_4_ = propertyRecord._4_4_ + 1) {
    propertyRecord._0_4_ = (&pPStack_20[1].count)[propertyRecord._4_4_];
    if ((Type)propertyRecord == 0xffffffff) {
      local_a8 = (PropertyRecord *)0x0;
    }
    else {
      local_a8 = ScriptContext::GetPropertyName((ScriptContext *)type_local,(Type)propertyRecord);
    }
    pPStack_50 = local_a8;
    local_51 = PropertyRecord::DefaultAttributesForPropertyId((Type)propertyRecord,true);
    SimpleDictionaryTypeHandlerBase<int,Js::PropertyRecord_const*,true>::
    Add<Js::PropertyRecord_const*>
              ((SimpleDictionaryTypeHandlerBase<int,Js::PropertyRecord_const*,true> *)_propertyId,
               pPStack_50,local_51,(bool)(recycler._7_1_ & 1),false,false,
               (ScriptContext *)type_local);
  }
  bVar3 = DynamicTypeHandler::GetFlags(&_propertyId->super_DynamicTypeHandler);
  if ((bVar3 & 0x20) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x179,"((typeHandler->GetFlags() & IsPrototypeFlag) == 0)",
                                "(typeHandler->GetFlags() & IsPrototypeFlag) == 0");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  pRVar6 = pRStack_30;
  *(int *)&type_local[0x32].typeHandler.ptr = *(int *)&type_local[0x32].typeHandler.ptr + 1;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_80,(type_info *)&DynamicType::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
             ,0x17f);
  pRVar6 = Memory::Recycler::TrackAllocInfo(pRVar6,&local_80);
  this = (DynamicType *)new<Memory::Recycler>(0x38,pRVar6,0x43c4b0);
  DynamicType::DynamicType
            (this,(DynamicType *)propIds_local,&_propertyId->super_DynamicTypeHandler,true,
             (bool)(recycler._7_1_ & 1));
  return this;
}

Assistant:

DynamicType* SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::InternalCreateTypeForNewScObject(ScriptContext* scriptContext, DynamicType* type, const Js::PropertyIdArray *propIds, bool shareType)
    {
        Recycler* recycler = scriptContext->GetRecycler();
        uint count = propIds->count;
        Assert(count <= static_cast<uint>(MaxPropertyIndexSize));

        SimpleDictionaryTypeHandlerBase* typeHandler = SimpleDictionaryTypeHandlerBase::New(recycler, count,
            type->GetTypeHandler()->GetInlineSlotCapacity(), type->GetTypeHandler()->GetOffsetOfInlineSlots(), true, shareType);
        if (!shareType) typeHandler->SetMayBecomeShared();

        for (uint i = 0; i < count; i++)
        {
            //
            // For a function with same named parameters,
            // property id Constants::NoProperty will be passed for all the dupes except the last one
            // We need to allocate space for dupes, but don't add those to map
            //
            PropertyId propertyId = propIds->elements[i];
            const PropertyRecord* propertyRecord = propertyId == Constants::NoProperty ? NULL : scriptContext->GetPropertyName(propertyId);
            PropertyAttributes attr = PropertyRecord::DefaultAttributesForPropertyId(propertyId, check__proto__);
            typeHandler->Add(propertyRecord, attr, shareType, false, false, scriptContext);
        }

        Assert((typeHandler->GetFlags() & IsPrototypeFlag) == 0);

#ifdef PROFILE_OBJECT_LITERALS
        scriptContext->objectLiteralSimpleDictionaryCount++;
#endif

        return RecyclerNew(recycler, DynamicType, type, typeHandler, /* isLocked = */ true, /* isShared = */ shareType);
    }